

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O3

void first_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int iVar1;
  
  if (n < 1) {
    *accum = 0x7ffffffe;
    iVar1 = 0x7ffffffe;
  }
  else {
    *accum = *vals;
    iVar1 = *auxs;
  }
  *accum_aux = iVar1;
  return;
}

Assistant:

static void first_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	if (n > 0) {
		*accum = vals[0];
		*accum_aux = auxs[0];
	} else {
		*accum = UI_ENTRY_VALUE_NOT_PRESENT;
		*accum_aux = UI_ENTRY_VALUE_NOT_PRESENT;
	}
}